

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwebp.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  char *__s1_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint local_174;
  char *local_160;
  int parse_error;
  int local_140;
  undefined4 local_13c;
  uint8_t *data;
  int local_12c;
  WebPDecoderConfig config;
  size_t data_size;
  
  data = (uint8_t *)0x0;
  iVar2 = WebPInitDecoderConfigInternal(&config,0x209);
  if (iVar2 == 0) {
    fwrite("Library version mismatch!\n",0x1a,1,stderr);
    return 1;
  }
  iVar2 = 1;
  local_12c = argc + -4;
  local_140 = argc + -2;
  local_174 = 0;
  local_13c = 0;
  local_160 = (char *)0x0;
LAB_00102634:
  if (argc <= iVar2) {
LAB_00102d29:
    if (local_160 == (char *)0x0) {
      fwrite("missing input file!!\n",0x15,1,stderr);
LAB_00102dab:
      Help();
    }
    else {
      if (quiet == '\x01') {
        verbose = 0;
      }
      data_size = 0;
      iVar2 = LoadWebP(local_160,&data,&data_size,&config.input);
      if (iVar2 != 0) {
        iVar2 = (*(code *)(&DAT_00172004 + *(int *)(&DAT_00172004 + (ulong)local_174 * 4)))();
        return iVar2;
      }
    }
    return 1;
  }
  parse_error = 0;
  __s1 = argv[iVar2];
  cVar1 = *__s1;
  if ((((cVar1 == '-') && (__s1[1] == 'h')) && (__s1[2] == '\0')) ||
     (iVar3 = strcmp(__s1,"-help"), iVar3 == 0)) {
    Help();
    return 0;
  }
  if (((cVar1 == '-') && (__s1[1] == 'o')) && ((__s1[2] == '\0' && (iVar2 < argc + -1)))) {
    iVar3 = iVar2 + 1;
    __s1 = local_160;
  }
  else {
    bVar6 = argc + -1 <= iVar2;
    iVar4 = strcmp(__s1,"-alpha");
    iVar3 = iVar2;
    if (iVar4 == 0) {
      local_174 = 7;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-nofancy");
    if (iVar4 == 0) {
      config.options.no_fancy_upsampling = 1;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-nofilter");
    if (iVar4 == 0) {
      config.options.bypass_filtering = 1;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-pam");
    if (iVar4 == 0) {
      local_174 = 1;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-ppm");
    if (iVar4 == 0) {
      local_174 = 2;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-bmp");
    if (iVar4 == 0) {
      local_174 = 4;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-tiff");
    if (iVar4 == 0) {
      local_174 = 5;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-quiet");
    if (iVar4 == 0) {
      quiet = '\x01';
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-version");
    if (iVar4 == 0) {
      uVar5 = WebPGetDecoderVersion();
      printf("%d.%d.%d\n",(ulong)(uVar5 >> 0x10 & 0xff),(ulong)(uVar5 >> 8 & 0xff),
             (ulong)(uVar5 & 0xff));
      return 0;
    }
    iVar4 = strcmp(__s1,"-pgm");
    if (iVar4 == 0) {
      local_174 = 3;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-yuv");
    if (iVar4 == 0) {
      local_174 = 6;
      __s1 = local_160;
      goto LAB_00102942;
    }
    iVar4 = strcmp(__s1,"-pixel_format");
    if (iVar4 != 0 || bVar6) {
      iVar4 = strcmp(__s1,"-external_memory");
      if (iVar4 == 0 && !bVar6) {
        iVar3 = iVar2 + 1;
        uVar5 = ExUtilGetInt(argv[(long)iVar2 + 1],0,&parse_error);
        parse_error = parse_error | (uint)(2 < uVar5);
        if (parse_error != 0) {
          fprintf(stderr,"Can\'t parse \'external_memory\' value %s\n",argv[(long)iVar2 + 1]);
          __s1 = local_160;
          goto LAB_00102942;
        }
        goto LAB_0010294d;
      }
      iVar4 = strcmp(__s1,"-mt");
      if (iVar4 == 0) {
        config.options.use_threads = 1;
        __s1 = local_160;
      }
      else {
        iVar4 = strcmp(__s1,"-alpha_dither");
        if (iVar4 == 0) {
          config.options.alpha_dithering_strength = 100;
          __s1 = local_160;
        }
        else {
          iVar4 = strcmp(__s1,"-nodither");
          if (iVar4 == 0) {
            config.options.dithering_strength = 0;
            __s1 = local_160;
          }
          else {
            iVar4 = strcmp(__s1,"-dither");
            if (iVar4 == 0 && !bVar6) {
              config.options.dithering_strength = ExUtilGetInt(argv[(long)iVar2 + 1],0,&parse_error)
              ;
              iVar3 = iVar2 + 1;
              __s1 = local_160;
            }
            else {
              iVar4 = strcmp(__s1,"-crop");
              if (iVar2 < local_12c && iVar4 == 0) {
                config.options.use_cropping = 1;
                config.options.crop_left = ExUtilGetInt(argv[(long)iVar2 + 1],0,&parse_error);
                config.options.crop_top = ExUtilGetInt(argv[(long)iVar2 + 2],0,&parse_error);
                config.options.crop_width = ExUtilGetInt(argv[(long)iVar2 + 3],0,&parse_error);
                config.options.crop_height = ExUtilGetInt(argv[(long)iVar2 + 4],0,&parse_error);
                iVar3 = iVar2 + 4;
                __s1 = local_160;
              }
              else {
                iVar4 = strcmp(__s1,"-scale");
                if (iVar4 == 0) {
                  if (iVar2 < local_140) goto LAB_00102b68;
                }
                else {
                  iVar4 = strcmp(__s1,"-resize");
                  if (iVar4 == 0 && iVar2 < local_140) {
LAB_00102b68:
                    config.options.use_scaling = 1;
                    config.options.scaled_width = ExUtilGetInt(argv[(long)iVar2 + 1],0,&parse_error)
                    ;
                    config.options.scaled_height =
                         ExUtilGetInt(argv[(long)iVar2 + 2],0,&parse_error);
                    iVar3 = iVar2 + 2;
                    __s1 = local_160;
                    goto LAB_00102942;
                  }
                }
                iVar4 = strcmp(__s1,"-flip");
                if (iVar4 == 0) {
                  config.options.flip = 1;
                  __s1 = local_160;
                }
                else {
                  if (((cVar1 == '-') && (__s1[1] == 'v')) && (__s1[2] == '\0')) {
                    verbose = 1;
                    __s1 = local_160;
                    goto LAB_00102942;
                  }
                  iVar4 = strcmp(__s1,"-noasm");
                  if (iVar4 == 0) {
                    VP8GetCPUInfo = (VP8CPUInfo)0x0;
                    __s1 = local_160;
                  }
                  else {
                    iVar4 = strcmp(__s1,"-incremental");
                    if (iVar4 == 0) {
                      local_13c = 1;
                      __s1 = local_160;
                    }
                    else if (cVar1 == '-') {
                      if ((__s1[1] != '-') || (__s1[2] != '\0')) {
                        fprintf(stderr,"Unknown option \'%s\'\n",__s1);
                        goto LAB_00102dab;
                      }
                      if (!bVar6) {
                        local_160 = argv[(long)iVar2 + 1];
                      }
                      goto LAB_00102d29;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar3 = iVar2 + 1;
      __s1_00 = argv[(long)iVar2 + 1];
      iVar2 = strcmp(__s1_00,"RGB");
      if (iVar2 == 0) {
        local_174 = 8;
        __s1 = local_160;
      }
      else {
        iVar2 = strcmp(__s1_00,"RGBA");
        if (iVar2 == 0) {
          local_174 = 9;
          __s1 = local_160;
        }
        else {
          iVar2 = strcmp(__s1_00,"BGR");
          if (iVar2 == 0) {
            local_174 = 10;
            __s1 = local_160;
          }
          else {
            iVar2 = strcmp(__s1_00,"BGRA");
            if (iVar2 == 0) {
              local_174 = 0xb;
              __s1 = local_160;
            }
            else {
              iVar2 = strcmp(__s1_00,"ARGB");
              if (iVar2 == 0) {
                local_174 = 0xc;
                __s1 = local_160;
              }
              else {
                iVar2 = strcmp(__s1_00,"RGBA_4444");
                if (iVar2 == 0) {
                  local_174 = 0xd;
                  __s1 = local_160;
                }
                else {
                  iVar2 = strcmp(__s1_00,"RGB_565");
                  if (iVar2 == 0) {
                    local_174 = 0xe;
                    __s1 = local_160;
                  }
                  else {
                    iVar2 = strcmp(__s1_00,"rgbA");
                    if (iVar2 == 0) {
                      local_174 = 0xf;
                      __s1 = local_160;
                    }
                    else {
                      iVar2 = strcmp(__s1_00,"bgrA");
                      if (iVar2 == 0) {
                        local_174 = 0x10;
                        __s1 = local_160;
                      }
                      else {
                        iVar2 = strcmp(__s1_00,"Argb");
                        if (iVar2 == 0) {
                          local_174 = 0x11;
                          __s1 = local_160;
                        }
                        else {
                          iVar2 = strcmp(__s1_00,"rgbA_4444");
                          if (iVar2 == 0) {
                            local_174 = 0x12;
                            __s1 = local_160;
                          }
                          else {
                            iVar2 = strcmp(__s1_00,"YUV");
                            if (iVar2 == 0) {
                              local_174 = 0x13;
                              __s1 = local_160;
                              goto LAB_00102942;
                            }
                            iVar2 = strcmp(__s1_00,"YUVA");
                            local_174 = 0x14;
                            __s1 = local_160;
                            if (iVar2 != 0) {
                              fprintf(stderr,"Can\'t parse pixel_format %s\n",__s1_00);
                              parse_error = 1;
                              goto LAB_00102dab;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00102942:
  local_160 = __s1;
  if (parse_error != 0) goto LAB_00102dab;
LAB_0010294d:
  iVar2 = iVar3 + 1;
  goto LAB_00102634;
}

Assistant:

int main(int argc, const char* argv[]) {
  int ok = 0;
  const char* in_file = NULL;
  const char* out_file = NULL;

  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;
  WebPOutputFileFormat format = PNG;
  uint8_t* external_buffer = NULL;
  int use_external_memory = 0;
  const uint8_t* data = NULL;

  int incremental = 0;
  int c;

  INIT_WARGV(argc, argv);

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    int parse_error = 0;
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-o") && c < argc - 1) {
      out_file = (const char*)GET_WARGV(argv, ++c);
    } else if (!strcmp(argv[c], "-alpha")) {
      format = ALPHA_PLANE_ONLY;
    } else if (!strcmp(argv[c], "-nofancy")) {
      config.options.no_fancy_upsampling = 1;
    } else if (!strcmp(argv[c], "-nofilter")) {
      config.options.bypass_filtering = 1;
    } else if (!strcmp(argv[c], "-pam")) {
      format = PAM;
    } else if (!strcmp(argv[c], "-ppm")) {
      format = PPM;
    } else if (!strcmp(argv[c], "-bmp")) {
      format = BMP;
    } else if (!strcmp(argv[c], "-tiff")) {
      format = TIFF;
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("%d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-pgm")) {
      format = PGM;
    } else if (!strcmp(argv[c], "-yuv")) {
      format = RAW_YUV;
    } else if (!strcmp(argv[c], "-pixel_format") && c < argc - 1) {
      const char* const fmt = argv[++c];
      if      (!strcmp(fmt, "RGB"))  format = RGB;
      else if (!strcmp(fmt, "RGBA")) format = RGBA;
      else if (!strcmp(fmt, "BGR"))  format = BGR;
      else if (!strcmp(fmt, "BGRA")) format = BGRA;
      else if (!strcmp(fmt, "ARGB")) format = ARGB;
      else if (!strcmp(fmt, "RGBA_4444")) format = RGBA_4444;
      else if (!strcmp(fmt, "RGB_565")) format = RGB_565;
      else if (!strcmp(fmt, "rgbA")) format = rgbA;
      else if (!strcmp(fmt, "bgrA")) format = bgrA;
      else if (!strcmp(fmt, "Argb")) format = Argb;
      else if (!strcmp(fmt, "rgbA_4444")) format = rgbA_4444;
      else if (!strcmp(fmt, "YUV"))  format = YUV;
      else if (!strcmp(fmt, "YUVA")) format = YUVA;
      else {
        fprintf(stderr, "Can't parse pixel_format %s\n", fmt);
        parse_error = 1;
      }
    } else if (!strcmp(argv[c], "-external_memory") && c < argc - 1) {
      use_external_memory = ExUtilGetInt(argv[++c], 0, &parse_error);
      parse_error |= (use_external_memory > 2 || use_external_memory < 0);
      if (parse_error) {
        fprintf(stderr, "Can't parse 'external_memory' value %s\n", argv[c]);
      }
    } else if (!strcmp(argv[c], "-mt")) {
      config.options.use_threads = 1;
    } else if (!strcmp(argv[c], "-alpha_dither")) {
      config.options.alpha_dithering_strength = 100;
    } else if (!strcmp(argv[c], "-nodither")) {
      config.options.dithering_strength = 0;
    } else if (!strcmp(argv[c], "-dither") && c < argc - 1) {
      config.options.dithering_strength =
          ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-crop") && c < argc - 4) {
      config.options.use_cropping = 1;
      config.options.crop_left   = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_top    = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if ((!strcmp(argv[c], "-scale") || !strcmp(argv[c], "-resize")) &&
               c < argc - 2) {  // '-scale' is left for compatibility
      config.options.use_scaling = 1;
      config.options.scaled_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.scaled_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-flip")) {
      config.options.flip = 1;
    } else if (!strcmp(argv[c], "-v")) {
      verbose = 1;
#ifndef WEBP_DLL
    } else if (!strcmp(argv[c], "-noasm")) {
      VP8GetCPUInfo = NULL;
#endif
    } else if (!strcmp(argv[c], "-incremental")) {
      incremental = 1;
    } else if (!strcmp(argv[c], "--")) {
      if (c < argc - 1) in_file = (const char*)GET_WARGV(argv, ++c);
      break;
    } else if (argv[c][0] == '-') {
      fprintf(stderr, "Unknown option '%s'\n", argv[c]);
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    } else {
      in_file = (const char*)GET_WARGV(argv, c);
    }

    if (parse_error) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }
  }

  if (in_file == NULL) {
    fprintf(stderr, "missing input file!!\n");
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  if (quiet) verbose = 0;

  {
    VP8StatusCode status = VP8_STATUS_OK;
    size_t data_size = 0;
    if (!LoadWebP(in_file, &data, &data_size, bitstream)) {
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }

    switch (format) {
      case PNG:
#ifdef HAVE_WINCODEC_H
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
#else
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
#endif
        break;
      case PAM:
        output_buffer->colorspace = MODE_RGBA;
        break;
      case PPM:
        output_buffer->colorspace = MODE_RGB;  // drops alpha for PPM
        break;
      case BMP:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
        break;
      case TIFF:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
        break;
      case PGM:
      case RAW_YUV:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_YUVA : MODE_YUV;
        break;
      case ALPHA_PLANE_ONLY:
        output_buffer->colorspace = MODE_YUVA;
        break;
      // forced modes:
      case RGB: output_buffer->colorspace = MODE_RGB; break;
      case RGBA: output_buffer->colorspace = MODE_RGBA; break;
      case BGR: output_buffer->colorspace = MODE_BGR; break;
      case BGRA: output_buffer->colorspace = MODE_BGRA; break;
      case ARGB: output_buffer->colorspace = MODE_ARGB; break;
      case RGBA_4444: output_buffer->colorspace = MODE_RGBA_4444; break;
      case RGB_565: output_buffer->colorspace = MODE_RGB_565; break;
      case rgbA: output_buffer->colorspace = MODE_rgbA; break;
      case bgrA: output_buffer->colorspace = MODE_bgrA; break;
      case Argb: output_buffer->colorspace = MODE_Argb; break;
      case rgbA_4444: output_buffer->colorspace = MODE_rgbA_4444; break;
      case YUV: output_buffer->colorspace = MODE_YUV; break;
      case YUVA: output_buffer->colorspace = MODE_YUVA; break;
      default: goto Exit;
    }

    if (use_external_memory > 0 && format >= RGB) {
      external_buffer = AllocateExternalBuffer(&config, format,
                                               use_external_memory);
      if (external_buffer == NULL) goto Exit;
    }

    {
      Stopwatch stop_watch;
      if (verbose) StopwatchReset(&stop_watch);

      if (incremental) {
        status = DecodeWebPIncremental(data, data_size, &config);
      } else {
        status = DecodeWebP(data, data_size, &config);
      }
      if (verbose) {
        const double decode_time = StopwatchReadAndReset(&stop_watch);
        fprintf(stderr, "Time to decode picture: %.3fs\n", decode_time);
      }
    }

    ok = (status == VP8_STATUS_OK);
    if (!ok) {
      PrintWebPError(in_file, status);
      goto Exit;
    }
  }

  if (out_file != NULL) {
    if (!quiet) {
      WFPRINTF(stderr, "Decoded %s.", (const W_CHAR*)in_file);
      fprintf(stderr, " Dimensions: %d x %d %s. Format: %s. Now saving...\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
    }
    ok = SaveOutput(output_buffer, format, out_file);
  } else {
    if (!quiet) {
      WFPRINTF(stderr, "File %s can be decoded ", (const W_CHAR*)in_file);
      fprintf(stderr, "(dimensions: %d x %d %s. Format: %s).\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
      fprintf(stderr, "Nothing written; "
                      "use -o flag to save the result as e.g. PNG.\n");
    }
  }
 Exit:
  WebPFreeDecBuffer(output_buffer);
  WebPFree((void*)external_buffer);
  WebPFree((void*)data);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}